

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.cpp
# Opt level: O2

void * __thiscall
embree::GridMesh::getBufferData
          (GridMesh *this,RTCBufferType type,uint slot,BufferDataPointerType pointerType)

{
  RawBufferView *pRVar1;
  undefined8 *puVar2;
  allocator local_39;
  string local_38 [32];
  
  if (type == RTC_BUFFER_TYPE_VERTEX) {
    if ((this->vertices).size_active <= (ulong)slot) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar1 = &(this->vertices).items[slot].super_RawBufferView;
    if (pointerType == HOST) goto LAB_0025558d;
    if (pointerType != DEVICE) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer data pointer type specified",&local_39);
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  else {
    if (type != RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
      if (type != RTC_BUFFER_TYPE_GRID) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"unknown buffer type",&local_39);
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      if (slot != 0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      if (pointerType == HOST) {
        pRVar1 = (RawBufferView *)&(this->super_Geometry).field_0x58;
      }
      else {
        if (pointerType != DEVICE) {
          puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    (local_38,"invalid buffer data pointer type specified",&local_39);
          *puVar2 = &PTR__rtcore_error_021d38e0;
          *(undefined4 *)(puVar2 + 1) = 2;
          std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
          __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
        }
        pRVar1 = (RawBufferView *)&this->field_0x60;
      }
      goto LAB_0025558d;
    }
    if ((this->vertexAttribs).size_active <= (ulong)slot) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar1 = (this->vertexAttribs).items + slot;
    if (pointerType == HOST) goto LAB_0025558d;
    if (pointerType != DEVICE) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer data pointer type specified",&local_39);
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  pRVar1 = (RawBufferView *)&pRVar1->dptr_ofs;
LAB_0025558d:
  return pRVar1->ptr_ofs;
}

Assistant:

void* GridMesh::getBufferData(RTCBufferType type, unsigned int slot, BufferDataPointerType pointerType)
  {
    if (type == RTC_BUFFER_TYPE_GRID)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      return grids.getPtr(pointerType);
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX)
    {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      return vertices[slot].getPtr(pointerType);
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE)
    {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      return vertexAttribs[slot].getPtr(pointerType);
    }
    else
    {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
      return nullptr;
    }
  }